

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int vm_builtin_rand(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxu32 sVar1;
  uint uVar2;
  uint uVar3;
  
  sVar1 = jx9VmRandomNum(pCtx->pVm);
  if (1 < nArg) {
    uVar2 = jx9_value_to_int(*apArg);
    uVar3 = jx9_value_to_int(apArg[1]);
    if (uVar2 < uVar3) {
      uVar3 = (uVar3 + 1) - uVar2;
      if (uVar3 != 0) {
        sVar1 = sVar1 % uVar3 + uVar2;
      }
    }
    else if (uVar3 != 0) {
      sVar1 = sVar1 % uVar3;
    }
  }
  jx9_result_int64(pCtx,(ulong)sVar1);
  return 0;
}

Assistant:

static int vm_builtin_rand(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	sxu32 iNum;
	/* Generate the random number */
	iNum = jx9VmRandomNum(pCtx->pVm);
	if( nArg > 1 ){
		sxu32 iMin, iMax;
		iMin = (sxu32)jx9_value_to_int(apArg[0]);
		iMax = (sxu32)jx9_value_to_int(apArg[1]);
		if( iMin < iMax ){
			sxu32 iDiv = iMax+1-iMin;
			if( iDiv > 0 ){
				iNum = (iNum % iDiv)+iMin;
			}
		}else if(iMax > 0 ){
			iNum %= iMax;
		}
	}
	/* Return the number */
	jx9_result_int64(pCtx, (jx9_int64)iNum);
	return SXRET_OK;
}